

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void google::protobuf::text_format_unittest::TextFormatExtensionsTest::SetUpTestSuite(void)

{
  Nonnull<const_char_*> failure_msg;
  char *in_RCX;
  string_view path;
  Status local_38;
  string local_30;
  
  path._M_str = in_RCX;
  path._M_len = (size_t)"google/protobuf/testdata/text_format_unittest_extensions_data.txt";
  TestUtil::GetTestDataPath_abi_cxx11_(&local_30,(TestUtil *)0x41,path);
  File::ReadFileToString
            ((File *)&local_38,&local_30,(string *)static_proto_text_format__abi_cxx11_,false);
  if (local_38.rep_ == 1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            (&local_38,
                             "File::GetContents( TestUtil::GetTestDataPath(\"google/protobuf/testdata/\" \"text_format_unittest_extensions_data.txt\"), &static_proto_text_format_, true) is OK"
                            );
  }
  absl::lts_20250127::Status::~Status(&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38.rep_ == 1) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
             ,0x8e,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

static void SetUpTestSuite() {
    ABSL_CHECK_OK(File::GetContents(
        TestUtil::GetTestDataPath("google/protobuf/testdata/"
                                  "text_format_unittest_extensions_data.txt"),
        &static_proto_text_format_, true));
  }